

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

bool __thiscall mkvmuxer::Frame::CopyFrom(Frame *this,Frame *frame)

{
  uint64_t uVar1;
  int64_t iVar2;
  bool bVar3;
  
  if (this->frame_ != (uint8_t *)0x0) {
    operator_delete__(this->frame_);
  }
  this->frame_ = (uint8_t *)0x0;
  this->length_ = 0;
  if ((frame->length_ == 0) || (frame->frame_ == (uint8_t *)0x0)) {
LAB_00150d71:
    this->add_id_ = 0;
    if (this->additional_ != (uint8_t *)0x0) {
      operator_delete__(this->additional_);
    }
    this->additional_ = (uint8_t *)0x0;
    this->additional_length_ = 0;
    if ((frame->additional_length_ != 0) && (frame->additional_ != (uint8_t *)0x0)) {
      bVar3 = AddAdditionalData(this,frame->additional_,frame->additional_length_,frame->add_id_);
      if (!bVar3) goto LAB_00150de5;
    }
    this->duration_ = frame->duration_;
    this->duration_set_ = frame->duration_set_;
    this->is_key_ = frame->is_key_;
    uVar1 = frame->timestamp_;
    this->track_number_ = frame->track_number_;
    this->timestamp_ = uVar1;
    iVar2 = frame->reference_block_timestamp_;
    this->discard_padding_ = frame->discard_padding_;
    this->reference_block_timestamp_ = iVar2;
    this->reference_block_timestamp_set_ = frame->reference_block_timestamp_set_;
    bVar3 = true;
  }
  else {
    bVar3 = Init(this,frame->frame_,frame->length_);
    if (bVar3) goto LAB_00150d71;
LAB_00150de5:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool Frame::CopyFrom(const Frame& frame) {
  delete[] frame_;
  frame_ = NULL;
  length_ = 0;
  if (frame.length() > 0 && frame.frame() != NULL &&
      !Init(frame.frame(), frame.length())) {
    return false;
  }
  add_id_ = 0;
  delete[] additional_;
  additional_ = NULL;
  additional_length_ = 0;
  if (frame.additional_length() > 0 && frame.additional() != NULL &&
      !AddAdditionalData(frame.additional(), frame.additional_length(),
                         frame.add_id())) {
    return false;
  }
  duration_ = frame.duration();
  duration_set_ = frame.duration_set();
  is_key_ = frame.is_key();
  track_number_ = frame.track_number();
  timestamp_ = frame.timestamp();
  discard_padding_ = frame.discard_padding();
  reference_block_timestamp_ = frame.reference_block_timestamp();
  reference_block_timestamp_set_ = frame.reference_block_timestamp_set();
  return true;
}